

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O2

void encode_b(AV1_COMP *cpi,TileDataEnc *tile_data,ThreadData_conflict *td,TokenExtra **tp,
             int mi_row,int mi_col,RUN_TYPE dry_run,BLOCK_SIZE bsize,PARTITION_TYPE partition,
             PICK_MODE_CONTEXT *ctx,int *rate)

{
  MOTION_MODE MVar1;
  int subsampling_x;
  int subsampling_y;
  int iVar2;
  SequenceHeader *pSVar3;
  MB_MODE_INFO *mbmi;
  MB_MODE_INFO_EXT_FRAME *mbmi_ext_best;
  bool bVar4;
  uint8_t uVar5;
  char ref1;
  MOTION_MODE MVar6;
  ushort uVar7;
  long lVar8;
  MV_REFERENCE_FRAME ref0;
  MACROBLOCKD *xd;
  uint uVar9;
  undefined4 uVar11;
  int *piVar10;
  
  pSVar3 = (cpi->common).seq_params;
  subsampling_x = pSVar3->subsampling_x;
  subsampling_y = pSVar3->subsampling_y;
  av1_set_offsets_without_segment_id(cpi,&tile_data->tile_info,&td->mb,mi_row,mi_col,bsize);
  iVar2 = (td->mb).rdmult;
  uVar11 = 0;
  setup_block_rdmult(cpi,&td->mb,mi_row,mi_col,bsize,'\0',(MB_MODE_INFO *)0x0);
  mbmi = *(td->mb).e_mbd.mi;
  mbmi->partition = partition;
  piVar10 = (int *)CONCAT44(uVar11,(uint)dry_run);
  av1_update_state(cpi,td,ctx,mi_row,mi_col,bsize,dry_run);
  if (dry_run != 0) {
    encode_superblock(cpi,tile_data,td,tp,dry_run,bsize,piVar10);
    goto LAB_001cd1e7;
  }
  *(undefined4 *)((td->mb).mbmi_ext_frame)->cb_offset = *(undefined4 *)(td->mb).cb_offset;
  encode_superblock(cpi,tile_data,td,tp,'\0',bsize,piVar10);
  update_cb_offsets(&td->mb,bsize,subsampling_x,subsampling_y);
  pSVar3 = (cpi->common).seq_params;
  if (((pSVar3->sb_size == bsize) && (mbmi->skip_txfm == '\x01')) &&
     ((cpi->common).delta_q_info.delta_lf_present_flag != 0)) {
    uVar5 = pSVar3->monochrome;
    for (lVar8 = 0; (ulong)(uVar5 == '\0') * 2 + 2 != lVar8; lVar8 = lVar8 + 1) {
      mbmi->delta_lf[lVar8] = (td->mb).e_mbd.delta_lf[lVar8];
    }
    mbmi->delta_lf_from_base = (td->mb).e_mbd.delta_lf_from_base;
  }
  if ('\0' < mbmi->ref_frame[1]) {
    uVar7 = *(ushort *)&mbmi->field_0xa7;
    if (((uVar7 >> 9 & 1) == 0) || ((mbmi->interinter_comp).type == '\0')) {
      uVar7 = uVar7 & 0xfeff;
    }
    else {
      uVar7 = uVar7 | 0x100;
    }
    *(ushort *)&mbmi->field_0xa7 = uVar7;
  }
  if ((cpi->common).delta_q_info.delta_q_present_flag != 0) {
    pSVar3 = (cpi->common).seq_params;
    uVar9 = (mi_col | mi_row) & pSVar3->mib_size - 1U;
    if (pSVar3->sb_size == bsize) {
      if ((uVar9 == 0) && (mbmi->skip_txfm == '\0')) {
LAB_001cd34a:
        (td->mb).e_mbd.current_base_qindex = mbmi->current_qindex;
        if ((cpi->common).delta_q_info.delta_lf_present_flag != 0) {
          if ((cpi->common).delta_q_info.delta_lf_multi == 0) {
            (td->mb).e_mbd.delta_lf_from_base = mbmi->delta_lf_from_base;
          }
          else {
            uVar5 = pSVar3->monochrome;
            for (lVar8 = 0; (ulong)(uVar5 == '\0') * 2 + 2 != lVar8; lVar8 = lVar8 + 1) {
              (td->mb).e_mbd.delta_lf[lVar8] = mbmi->delta_lf[lVar8];
            }
          }
        }
      }
    }
    else if (uVar9 == 0) goto LAB_001cd34a;
  }
  xd = &(td->mb).e_mbd;
  uVar7 = *(ushort *)&mbmi->field_0xa7;
  if ((uVar7 & 0x40) == 0) {
    if ((((cpi->common).seg.enabled == '\0') ||
        (((cpi->common).seg.feature_mask[uVar7 & 7] & 0x20) == 0)) &&
       (((char)uVar7 < '\0' || ('\0' < mbmi->ref_frame[0])))) {
      av1_collect_neighbors_ref_counts(xd);
      ref1 = mbmi->ref_frame[1];
      if (((cpi->common).current_frame.reference_mode == '\x02') && ('\0' < ref1)) {
        (td->rd_counts).compound_ref_used_flag = 1;
        ref1 = mbmi->ref_frame[1];
      }
      ref0 = mbmi->ref_frame[0];
      goto LAB_001cd44b;
    }
  }
  else {
    (td->rd_counts).skip_mode_used_flag = 1;
    if ((cpi->common).current_frame.reference_mode == '\x02') {
      (td->rd_counts).compound_ref_used_flag = 1;
    }
    ref0 = mbmi->ref_frame[0];
    ref1 = mbmi->ref_frame[1];
LAB_001cd44b:
    set_ref_ptrs(&cpi->common,xd,ref0,ref1);
  }
  if (tile_data->allow_update_cdf != '\0') {
    update_stats(&cpi->common,td);
  }
  if ((0x80000001 < (cpi->sf).inter_sf.prune_obmc_prob_thresh + 0x80000001U) ||
     (((cpi->common).features.allow_warped_motion == true &&
      (0 < (cpi->sf).inter_sf.prune_warped_prob_thresh)))) {
    bVar4 = true;
    if (-1 < (char)*(ushort *)&mbmi->field_0xa7) {
      bVar4 = '\0' < mbmi->ref_frame[0];
    }
    if ((cpi->common).seg.enabled != '\0') {
      bVar4 = (bool)(((cpi->common).seg.feature_mask[*(ushort *)&mbmi->field_0xa7 & 7] & 0x20) == 0
                    & bVar4);
    }
    if (bVar4) {
      MVar6 = '\0';
      if ((cpi->common).features.switchable_motion_mode == true) {
        MVar6 = motion_mode_allowed((td->mb).e_mbd.global_motion,xd,mbmi,
                                    (uint)(cpi->common).features.allow_warped_motion);
      }
      if ((mbmi->ref_frame[1] != '\0') && (MVar6 != '\0')) {
        MVar1 = mbmi->motion_mode;
        piVar10 = (td->rd_counts).obmc_used[bsize] + (MVar1 == '\x01');
        *piVar10 = *piVar10 + 1;
        if (MVar6 == '\x02') {
          piVar10 = (td->rd_counts).warped_used + (MVar1 == '\x02');
          *piVar10 = *piVar10 + 1;
        }
      }
    }
  }
LAB_001cd1e7:
  mbmi_ext_best = (td->mb).mbmi_ext_frame;
  uVar5 = av1_ref_frame_type((*(td->mb).e_mbd.mi)->ref_frame);
  av1_copy_mbmi_ext_to_mbmi_ext_frame(mbmi_ext_best,&(td->mb).mbmi_ext,uVar5);
  (td->mb).rdmult = iVar2;
  return;
}

Assistant:

static void encode_b(const AV1_COMP *const cpi, TileDataEnc *tile_data,
                     ThreadData *td, TokenExtra **tp, int mi_row, int mi_col,
                     RUN_TYPE dry_run, BLOCK_SIZE bsize,
                     PARTITION_TYPE partition, PICK_MODE_CONTEXT *const ctx,
                     int *rate) {
  const AV1_COMMON *const cm = &cpi->common;
  TileInfo *const tile = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *xd = &x->e_mbd;
  const int subsampling_x = cm->seq_params->subsampling_x;
  const int subsampling_y = cm->seq_params->subsampling_y;

  av1_set_offsets_without_segment_id(cpi, tile, x, mi_row, mi_col, bsize);
  const int origin_mult = x->rdmult;
  setup_block_rdmult(cpi, x, mi_row, mi_col, bsize, NO_AQ, NULL);
  MB_MODE_INFO *mbmi = xd->mi[0];
  mbmi->partition = partition;
  av1_update_state(cpi, td, ctx, mi_row, mi_col, bsize, dry_run);

  if (!dry_run) {
    set_cb_offsets(x->mbmi_ext_frame->cb_offset, x->cb_offset[PLANE_TYPE_Y],
                   x->cb_offset[PLANE_TYPE_UV]);
    assert(x->cb_offset[PLANE_TYPE_Y] <
           (1 << num_pels_log2_lookup[cpi->common.seq_params->sb_size]));
    assert(x->cb_offset[PLANE_TYPE_UV] <
           ((1 << num_pels_log2_lookup[cpi->common.seq_params->sb_size]) >>
            (subsampling_x + subsampling_y)));
  }

  encode_superblock(cpi, tile_data, td, tp, dry_run, bsize, rate);

  if (!dry_run) {
    update_cb_offsets(x, bsize, subsampling_x, subsampling_y);
    if (bsize == cpi->common.seq_params->sb_size && mbmi->skip_txfm == 1 &&
        cm->delta_q_info.delta_lf_present_flag) {
      const int frame_lf_count =
          av1_num_planes(cm) > 1 ? FRAME_LF_COUNT : FRAME_LF_COUNT - 2;
      for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id)
        mbmi->delta_lf[lf_id] = xd->delta_lf[lf_id];
      mbmi->delta_lf_from_base = xd->delta_lf_from_base;
    }
    if (has_second_ref(mbmi)) {
      if (mbmi->compound_idx == 0 ||
          mbmi->interinter_comp.type == COMPOUND_AVERAGE)
        mbmi->comp_group_idx = 0;
      else
        mbmi->comp_group_idx = 1;
    }

    // delta quant applies to both intra and inter
    const int super_block_upper_left =
        ((mi_row & (cm->seq_params->mib_size - 1)) == 0) &&
        ((mi_col & (cm->seq_params->mib_size - 1)) == 0);
    const DeltaQInfo *const delta_q_info = &cm->delta_q_info;
    if (delta_q_info->delta_q_present_flag &&
        (bsize != cm->seq_params->sb_size || !mbmi->skip_txfm) &&
        super_block_upper_left) {
      xd->current_base_qindex = mbmi->current_qindex;
      if (delta_q_info->delta_lf_present_flag) {
        if (delta_q_info->delta_lf_multi) {
          const int frame_lf_count =
              av1_num_planes(cm) > 1 ? FRAME_LF_COUNT : FRAME_LF_COUNT - 2;
          for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id) {
            xd->delta_lf[lf_id] = mbmi->delta_lf[lf_id];
          }
        } else {
          xd->delta_lf_from_base = mbmi->delta_lf_from_base;
        }
      }
    }

    RD_COUNTS *rdc = &td->rd_counts;
    if (mbmi->skip_mode) {
      assert(!frame_is_intra_only(cm));
      rdc->skip_mode_used_flag = 1;
      if (cm->current_frame.reference_mode == REFERENCE_MODE_SELECT) {
        assert(has_second_ref(mbmi));
        rdc->compound_ref_used_flag = 1;
      }
      set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
    } else {
      const int seg_ref_active =
          segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_REF_FRAME);
      if (!seg_ref_active) {
        // If the segment reference feature is enabled we have only a single
        // reference frame allowed for the segment so exclude it from
        // the reference frame counts used to work out probabilities.
        if (is_inter_block(mbmi)) {
          av1_collect_neighbors_ref_counts(xd);
          if (cm->current_frame.reference_mode == REFERENCE_MODE_SELECT) {
            if (has_second_ref(mbmi)) {
              // This flag is also updated for 4x4 blocks
              rdc->compound_ref_used_flag = 1;
            }
          }
          set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
        }
      }
    }

    if (tile_data->allow_update_cdf) update_stats(&cpi->common, td);

    // Gather obmc and warped motion count to update the probability.
    if ((cpi->sf.inter_sf.prune_obmc_prob_thresh > 0 &&
         cpi->sf.inter_sf.prune_obmc_prob_thresh < INT_MAX) ||
        (cm->features.allow_warped_motion &&
         cpi->sf.inter_sf.prune_warped_prob_thresh > 0)) {
      const int inter_block = is_inter_block(mbmi);
      const int seg_ref_active =
          segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_REF_FRAME);
      if (!seg_ref_active && inter_block) {
        const MOTION_MODE motion_allowed =
            cm->features.switchable_motion_mode
                ? motion_mode_allowed(xd->global_motion, xd, mbmi,
                                      cm->features.allow_warped_motion)
                : SIMPLE_TRANSLATION;

        if (mbmi->ref_frame[1] != INTRA_FRAME) {
          if (motion_allowed >= OBMC_CAUSAL) {
            td->rd_counts.obmc_used[bsize][mbmi->motion_mode == OBMC_CAUSAL]++;
          }
          if (motion_allowed == WARPED_CAUSAL) {
            td->rd_counts.warped_used[mbmi->motion_mode == WARPED_CAUSAL]++;
          }
        }
      }
    }
  }
  // TODO(Ravi/Remya): Move this copy function to a better logical place
  // This function will copy the best mode information from block
  // level (x->mbmi_ext) to frame level (cpi->mbmi_ext_info.frame_base). This
  // frame level buffer (cpi->mbmi_ext_info.frame_base) will be used during
  // bitstream preparation.
  av1_copy_mbmi_ext_to_mbmi_ext_frame(x->mbmi_ext_frame, &x->mbmi_ext,
                                      av1_ref_frame_type(xd->mi[0]->ref_frame));
  x->rdmult = origin_mult;
}